

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O2

void __thiscall TApp_IniFlagDual_Test::~TApp_IniFlagDual_Test(TApp_IniFlagDual_Test *this)

{
  TApp::~TApp(&this->super_TApp);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, IniFlagDual) {

    TempFile tmpini{"TestIniTmp.ini"};

    bool boo;
    app.add_flag("--flag", boo);
    app.set_config("--config", tmpini);

    {
        std::ofstream out{tmpini};
        out << "flag=1 1" << std::endl;
    }

    EXPECT_THROW(run(), CLI::ConversionError);
}